

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

Result<vkb::Device> * __thiscall
vkb::DeviceBuilder::build(Result<vkb::Device> *__return_storage_ptr__,DeviceBuilder *this)

{
  VkPhysicalDeviceFeatures *__src;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *__x;
  pointer pbVar1;
  VkBaseOutStructure *pVVar2;
  VkBaseOutStructure **ppVVar3;
  undefined8 uVar4;
  VkSurfaceKHR pVVar5;
  VkAllocationCallbacks *pVVar6;
  void *pvVar7;
  bool bVar8;
  pointer pCVar9;
  VkPhysicalDeviceFeatures *pVVar10;
  VkResult VVar11;
  pointer ppVVar12;
  ulong uVar13;
  VkBaseOutStructure **pnext;
  VkBaseOutStructure **__args;
  CustomQueueDescription *desc;
  pointer pCVar14;
  pointer pbVar15;
  GenericFeaturesPNextNode *features_node;
  pointer pGVar16;
  initializer_list<float> __l;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> final_pnext_chain;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> queueCreateInfos;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions_to_enable;
  vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
  queue_descriptions;
  GenericFeatureChain physical_device_extension_features_copy;
  VkDeviceCreateInfo device_create_info;
  Device device;
  VkPhysicalDeviceFeatures2 local_features2;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> local_918;
  VkDeviceQueueCreateInfo *local_8f8;
  iterator iStack_8f0;
  VkDeviceQueueCreateInfo *local_8e8;
  Result<vkb::Device> *local_8e0;
  char **local_8d8;
  long lStack_8d0;
  long local_8c8;
  vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_> local_8b8;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  local_8a0;
  VkDeviceCreateInfo local_888;
  undefined1 local_838 [8];
  _Alloc_hider _Stack_830;
  pointer local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_820;
  undefined1 local_810 [240];
  undefined1 local_720 [296];
  undefined1 local_5f8 [528];
  undefined1 local_3e8 [520];
  uint32_t local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1c0;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> local_1a8;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  vStack_190;
  undefined2 local_178;
  undefined2 uStack_176;
  Suitable SStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> vStack_168;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  uint32_t uStack_140;
  PFN_vkGetDeviceQueue local_138;
  PFN_vkDestroyDevice p_Stack_130;
  VkStructureType local_120;
  
  local_8b8.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8b8.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8b8.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<vkb::CustomQueueDescription_const*,std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>>>
            ((vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>> *)
             &local_8b8,0,
             (this->info).queue_descriptions.
             super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->info).queue_descriptions.
             super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((local_8b8.
       super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_8b8.
       super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (local_120 = VK_STRUCTURE_TYPE_APPLICATION_INFO, local_8e0 = __return_storage_ptr__,
     (this->physical_device).queue_families.
     super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
     super__Vector_impl_data._M_finish !=
     (this->physical_device).queue_families.
     super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
     super__Vector_impl_data._M_start)) {
    do {
      local_888.sType = 0x3f800000;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_888;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_838,__l,(allocator_type *)&local_8f8
                );
      std::vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>>::
      emplace_back<unsigned_int&,std::vector<float,std::allocator<float>>>
                ((vector<vkb::CustomQueueDescription,std::allocator<vkb::CustomQueueDescription>> *)
                 &local_8b8,&stack0xfffffffffffffee0,
                 (vector<float,_std::allocator<float>_> *)local_838);
      if (local_838 != (undefined1  [8])0x0) {
        operator_delete((void *)local_838,(long)local_828 - (long)local_838);
      }
      local_120 = local_120 + VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
      uVar13 = ((long)(this->physical_device).queue_families.
                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->physical_device).queue_families.
                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      __return_storage_ptr__ = local_8e0;
    } while (local_120 <= uVar13 && uVar13 - local_120 != 0);
  }
  pCVar9 = local_8b8.
           super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_8f8 = (VkDeviceQueueCreateInfo *)0x0;
  iStack_8f0._M_current = (VkDeviceQueueCreateInfo *)0x0;
  local_8e8 = (VkDeviceQueueCreateInfo *)0x0;
  if (local_8b8.
      super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_8b8.
      super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pCVar14 = local_8b8.
              super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      _Stack_830._M_p = (pointer)0x0;
      local_838 = (undefined1  [8])0x2;
      local_828 = (pointer)((ulong)pCVar14->index << 0x20);
      aStack_820._8_8_ =
           (pCVar14->priorities).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      aStack_820._M_allocated_capacity =
           (ulong)((long)(pCVar14->priorities).super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_finish - aStack_820._8_8_) >> 2 &
           0xffffffff;
      if (iStack_8f0._M_current == local_8e8) {
        std::vector<VkDeviceQueueCreateInfo,std::allocator<VkDeviceQueueCreateInfo>>::
        _M_realloc_insert<VkDeviceQueueCreateInfo_const&>
                  ((vector<VkDeviceQueueCreateInfo,std::allocator<VkDeviceQueueCreateInfo>> *)
                   &local_8f8,iStack_8f0,(VkDeviceQueueCreateInfo *)local_838);
      }
      else {
        (iStack_8f0._M_current)->pQueuePriorities = (float *)aStack_820._8_8_;
        *(pointer *)&(iStack_8f0._M_current)->flags = local_828;
        *(size_type *)&(iStack_8f0._M_current)->queueCount = aStack_820._M_allocated_capacity;
        *(undefined8 *)iStack_8f0._M_current = 2;
        (iStack_8f0._M_current)->pNext = (void *)0x0;
        iStack_8f0._M_current = iStack_8f0._M_current + 1;
      }
      pCVar14 = pCVar14 + 1;
    } while (pCVar14 != pCVar9);
  }
  local_8d8 = (char **)0x0;
  lStack_8d0 = 0;
  local_8c8 = 0;
  pbVar15 = (this->physical_device).extensions_to_enable.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->physical_device).extensions_to_enable.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar15 != pbVar1) {
    do {
      local_838 = (undefined1  [8])(pbVar15->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_8d8,(char **)local_838);
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 != pbVar1);
  }
  if (((this->physical_device).surface != (VkSurfaceKHR)0x0) ||
     ((this->physical_device).defer_surface_initialization == true)) {
    local_838 = (undefined1  [8])0x14f282;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_8d8,(char **)local_838);
  }
  local_918.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_start = (VkBaseOutStructure **)0x0;
  local_918.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (VkBaseOutStructure **)0x0;
  local_918.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (VkBaseOutStructure **)0x0;
  local_888.pEnabledFeatures = (VkPhysicalDeviceFeatures *)0x0;
  local_888.enabledExtensionCount = 0;
  local_888._52_4_ = 0;
  local_888.ppEnabledExtensionNames = (char **)0x0;
  local_888.enabledLayerCount = 0;
  local_888._36_4_ = 0;
  local_888.ppEnabledLayerNames = (char **)0x0;
  local_888.flags = 0;
  local_888.queueCreateInfoCount = 0;
  local_888.pQueueCreateInfos = (VkDeviceQueueCreateInfo *)0x0;
  local_888.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_888._4_4_ = 0;
  local_888.pNext = (void *)0x0;
  ppVVar12 = (this->info).pNext_chain.
             super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  do {
    bVar8 = false;
    if (ppVVar12 ==
        (this->info).pNext_chain.
        super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00122b1f;
    pVVar2 = *ppVVar12;
    ppVVar12 = ppVVar12 + 1;
  } while (pVVar2->sType != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2);
  bVar8 = true;
LAB_00122b1f:
  if ((bVar8) &&
     ((this->physical_device).extended_features_chain.nodes.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->physical_device).extended_features_chain.nodes.
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    (__return_storage_ptr__->field_0).m_error.type._M_value = 1;
    (__return_storage_ptr__->field_0).m_value.physical_device.name._M_dataplus._M_p =
         (pointer)&detail::device_error_category;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    __return_storage_ptr__->m_init = false;
  }
  else {
    local_8e0 = (Result<vkb::Device> *)&(this->physical_device).extended_features_chain;
    std::
    vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ::vector(&local_8a0,
             (vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
              *)local_8e0);
    memset((pointer)&stack0xfffffffffffffee0,0,0xf0);
    local_120 = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
    __src = &(this->physical_device).features;
    memcpy(&stack0xfffffffffffffef0,__src,0xdc);
    pVVar10 = local_888.pEnabledFeatures;
    if ((!bVar8) &&
       (((0x400fff < (this->physical_device).instance_version ||
         (pVVar10 = __src, (this->physical_device).properties2_ext_enabled == true)) &&
        (local_838 = (undefined1  [8])&stack0xfffffffffffffee0,
        std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
        emplace_back<VkBaseOutStructure*>
                  ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)&local_918,
                   (VkBaseOutStructure **)local_838), pVVar10 = local_888.pEnabledFeatures,
        local_8a0.
        super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_8a0.
        super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
        ._M_impl.super__Vector_impl_data._M_finish)))) {
      pGVar16 = local_8a0.
                super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_838 = (undefined1  [8])pGVar16;
        std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
        emplace_back<VkBaseOutStructure*>
                  ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)&local_918,
                   (VkBaseOutStructure **)local_838);
        pGVar16 = pGVar16 + 1;
        pVVar10 = local_888.pEnabledFeatures;
      } while (pGVar16 !=
               local_8a0.
               super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_888.pEnabledFeatures = pVVar10;
    ppVVar3 = (this->info).pNext_chain.
              super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (__args = (this->info).pNext_chain.
                  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; __args != ppVVar3; __args = __args + 1)
    {
      if (local_918.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_918.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>>::
        _M_realloc_insert<VkBaseOutStructure*const&>
                  ((vector<VkBaseOutStructure*,std::allocator<VkBaseOutStructure*>> *)&local_918,
                   (iterator)
                   local_918.
                   super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        *local_918.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = *__args;
        local_918.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_918.
             super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl
             .super__Vector_impl_data._M_finish + 1;
      }
    }
    detail::setup_pNext_chain<VkDeviceCreateInfo>(&local_888,&local_918);
    for (ppVVar12 = local_918.
                    super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ppVVar12 !=
        local_918.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppVVar12 = ppVVar12 + 1) {
      if ((*ppVVar12)->sType == VK_STRUCTURE_TYPE_APPLICATION_INFO) {
        __assert_fail("node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO",
                      "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                      ,0x6a4,"Result<Device> vkb::DeviceBuilder::build() const");
      }
    }
    local_888.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
    local_888.queueCreateInfoCount =
         (int)((ulong)((long)iStack_8f0._M_current - (long)local_8f8) >> 3) * -0x33333333;
    local_888.flags = (this->info).flags;
    local_888.pQueueCreateInfos = local_8f8;
    local_888.enabledExtensionCount = (uint32_t)((ulong)(lStack_8d0 - (long)local_8d8) >> 3);
    local_888.ppEnabledExtensionNames = local_8d8;
    _Stack_830._M_p = (pointer)&aStack_820;
    local_838 = (undefined1  [8])0x0;
    local_828 = (pointer)0x0;
    aStack_820._M_allocated_capacity = aStack_820._M_allocated_capacity & 0xffffffffffffff00;
    memset(local_810,0,0xec);
    memset(local_720,0,0x124);
    memset(local_5f8,0,0x20c);
    memset(local_3e8,0,0x208);
    local_1e0 = 0x400000;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_1c0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_1c0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_1c0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_190.
    super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_190.
    super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_190.
    super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178._0_1_ = false;
    local_178._1_1_ = false;
    SStack_174 = yes;
    uStack_170 = 0;
    uStack_16c = 0;
    vStack_168.super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    vStack_168.super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
    vStack_168.super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    vStack_168.super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    vStack_168.super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    vStack_168.super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    uStack_150 = 0;
    uStack_14c = 0;
    uStack_148 = 0;
    uStack_144 = 0;
    uStack_140 = 0x400000;
    local_138 = (PFN_vkGetDeviceQueue)0x0;
    p_Stack_130 = (PFN_vkDestroyDevice)0x0;
    VVar11 = (*(code *)detail::vulkan_functions()::v._184_8_)
                       ((this->physical_device).physical_device,&local_888,
                        (this->info).allocation_callbacks,local_838);
    if (VVar11 == VK_SUCCESS) {
      std::__cxx11::string::_M_assign((string *)&_Stack_830);
      memcpy(local_810,&(this->physical_device).physical_device,0x634);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_1d8,&(this->physical_device).extensions_to_enable);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&vStack_1c0,&(this->physical_device).available_extensions);
      __x = &(this->physical_device).queue_families;
      std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::operator=
                (&local_1a8,__x);
      std::
      vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ::operator=(&vStack_190,
                  (vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                   *)local_8e0);
      uVar4._0_1_ = (this->physical_device).defer_surface_initialization;
      uVar4._1_1_ = (this->physical_device).properties2_ext_enabled;
      uVar4._2_2_ = *(undefined2 *)&(this->physical_device).field_0x6ba;
      uVar4._4_4_ = (this->physical_device).suitable;
      local_178 = (undefined2)uVar4;
      pVVar5 = (this->physical_device).surface;
      uStack_170 = SUB84(pVVar5,0);
      uStack_16c = (undefined4)((ulong)pVVar5 >> 0x20);
      uStack_176 = uVar4._2_2_;
      SStack_174 = uVar4._4_4_;
      std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::operator=
                (&vStack_168,__x);
      pVVar6 = (this->info).allocation_callbacks;
      uStack_150 = SUB84(pVVar6,0);
      uStack_14c = (undefined4)((ulong)pVVar6 >> 0x20);
      uStack_148 = (undefined4)detail::vulkan_functions()::v._192_8_;
      uStack_144 = SUB84(detail::vulkan_functions()::v._192_8_,4);
      local_138 = (PFN_vkGetDeviceQueue)
                  (*(code *)detail::vulkan_functions()::v._192_8_)(local_838,"vkGetDeviceQueue");
      p_Stack_130 = (PFN_vkDestroyDevice)
                    (*(code *)detail::vulkan_functions()::v._192_8_)(local_838,"vkDestroyDevice");
      uStack_140 = (this->physical_device).instance_version;
      Result<vkb::Device>::Result(__return_storage_ptr__,(Device *)local_838);
    }
    else {
      (__return_storage_ptr__->field_0).m_error.type._M_value = 0;
      (__return_storage_ptr__->field_0).m_value.physical_device.name._M_dataplus._M_p =
           (pointer)&detail::device_error_category;
      (__return_storage_ptr__->field_0).m_error.vk_result = VVar11;
      __return_storage_ptr__->m_init = false;
    }
    pvVar7 = (void *)CONCAT44(vStack_168.
                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              vStack_168.
                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_4_);
    if (pvVar7 != (void *)0x0) {
      operator_delete(pvVar7,CONCAT44(vStack_168.
                                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                      vStack_168.
                                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                             (long)pvVar7);
    }
    if (vStack_190.
        super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_190.
                      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)vStack_190.
                            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_190.
                            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1a8.
        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a8.
                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a8.
                            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.
                            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_1c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_830._M_p != &aStack_820) {
      operator_delete(_Stack_830._M_p,aStack_820._M_allocated_capacity + 1);
    }
    if (local_8a0.
        super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_8a0.
                      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_8a0.
                            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_8a0.
                            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_918.super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (VkBaseOutStructure **)0x0) {
    operator_delete(local_918.
                    super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_918.
                          super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_918.
                          super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_8d8 != (char **)0x0) {
    operator_delete(local_8d8,local_8c8 - (long)local_8d8);
  }
  if (local_8f8 != (VkDeviceQueueCreateInfo *)0x0) {
    operator_delete(local_8f8,(long)local_8e8 - (long)local_8f8);
  }
  std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>::~vector
            (&local_8b8);
  return __return_storage_ptr__;
}

Assistant:

Result<Device> DeviceBuilder::build() const {

    std::vector<CustomQueueDescription> queue_descriptions;
    queue_descriptions.insert(queue_descriptions.end(), info.queue_descriptions.begin(), info.queue_descriptions.end());

    if (queue_descriptions.empty()) {
        for (uint32_t i = 0; i < physical_device.queue_families.size(); i++) {
            queue_descriptions.emplace_back(i, std::vector<float>{ 1.0f });
        }
    }

    std::vector<VkDeviceQueueCreateInfo> queueCreateInfos;
    for (auto& desc : queue_descriptions) {
        VkDeviceQueueCreateInfo queue_create_info = {};
        queue_create_info.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
        queue_create_info.queueFamilyIndex = desc.index;
        queue_create_info.queueCount = static_cast<std::uint32_t>(desc.priorities.size());
        queue_create_info.pQueuePriorities = desc.priorities.data();
        queueCreateInfos.push_back(queue_create_info);
    }

    std::vector<const char*> extensions_to_enable;
    for (const auto& ext : physical_device.extensions_to_enable) {
        extensions_to_enable.push_back(ext.c_str());
    }
    if (physical_device.surface != VK_NULL_HANDLE || physical_device.defer_surface_initialization)
        extensions_to_enable.push_back({ VK_KHR_SWAPCHAIN_EXTENSION_NAME });

    std::vector<VkBaseOutStructure*> final_pnext_chain;
    VkDeviceCreateInfo device_create_info = {};

    bool user_defined_phys_dev_features_2 = false;
    for (auto& pnext : info.pNext_chain) {
        if (pnext->sType == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2) {
            user_defined_phys_dev_features_2 = true;
            break;
        }
    }

    if (user_defined_phys_dev_features_2 && !physical_device.extended_features_chain.nodes.empty()) {
        return { DeviceError::VkPhysicalDeviceFeatures2_in_pNext_chain_while_using_add_required_extension_features };
    }

    // These objects must be alive during the call to vkCreateDevice
    auto physical_device_extension_features_copy = physical_device.extended_features_chain;
    VkPhysicalDeviceFeatures2 local_features2{};
    local_features2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
    local_features2.features = physical_device.features;

    if (!user_defined_phys_dev_features_2) {
        if (physical_device.instance_version >= VKB_VK_API_VERSION_1_1 || physical_device.properties2_ext_enabled) {
            final_pnext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&local_features2));
            for (auto& features_node : physical_device_extension_features_copy.nodes) {
                final_pnext_chain.push_back(reinterpret_cast<VkBaseOutStructure*>(&features_node));
            }
        } else {
            // Only set device_create_info.pEnabledFeatures when the pNext chain does not contain a VkPhysicalDeviceFeatures2 structure
            device_create_info.pEnabledFeatures = &physical_device.features;
        }
    }

    for (auto& pnext : info.pNext_chain) {
        final_pnext_chain.push_back(pnext);
    }

    detail::setup_pNext_chain(device_create_info, final_pnext_chain);
#if !defined(NDEBUG)
    for (auto& node : final_pnext_chain) {
        assert(node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO);
    }
#endif
    device_create_info.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
    device_create_info.flags = info.flags;
    device_create_info.queueCreateInfoCount = static_cast<uint32_t>(queueCreateInfos.size());
    device_create_info.pQueueCreateInfos = queueCreateInfos.data();
    device_create_info.enabledExtensionCount = static_cast<uint32_t>(extensions_to_enable.size());
    device_create_info.ppEnabledExtensionNames = extensions_to_enable.data();

    Device device;

    VkResult res = detail::vulkan_functions().fp_vkCreateDevice(
        physical_device.physical_device, &device_create_info, info.allocation_callbacks, &device.device);
    if (res != VK_SUCCESS) {
        return { DeviceError::failed_create_device, res };
    }

    device.physical_device = physical_device;
    device.surface = physical_device.surface;
    device.queue_families = physical_device.queue_families;
    device.allocation_callbacks = info.allocation_callbacks;
    device.fp_vkGetDeviceProcAddr = detail::vulkan_functions().fp_vkGetDeviceProcAddr;
    detail::vulkan_functions().get_device_proc_addr(device.device, device.internal_table.fp_vkGetDeviceQueue, "vkGetDeviceQueue");
    detail::vulkan_functions().get_device_proc_addr(device.device, device.internal_table.fp_vkDestroyDevice, "vkDestroyDevice");
    device.instance_version = physical_device.instance_version;
    return device;
}